

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::RenderDeviceGLImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::RenderDeviceGLImpl>::operator=
          (RefCntAutoPtr<Diligent::RenderDeviceGLImpl> *this,RenderDeviceGLImpl *pObj)

{
  RenderDeviceGLImpl *pObj_local;
  RefCntAutoPtr<Diligent::RenderDeviceGLImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (RenderDeviceGLImpl *)0x0) {
      RenderDeviceBase<Diligent::EngineGLImplTraits>::Release
                (&this->m_pObject->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (RenderDeviceGLImpl *)0x0) {
      RefCountedObject<Diligent::IRenderDeviceGL>::AddRef
                ((RefCountedObject<Diligent::IRenderDeviceGL> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }